

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O1

void gflags::ShowXMLOfFlags(char *prog_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FILE *pFVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  pointer txt;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> flags;
  allocator local_89;
  string local_88;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> local_68;
  string local_50;
  
  local_68.
  super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetAllFlags(&local_68);
  fwrite("<?xml version=\"1.0\"?>\n",0x16,1,_stdout);
  fwrite("<AllFlags>\n",0xb,1,_stdout);
  pFVar2 = _stdout;
  pcVar4 = strrchr(prog_name,0x2f);
  pcVar5 = pcVar4 + 1;
  if (pcVar4 == (char *)0x0) {
    pcVar5 = prog_name;
  }
  std::__cxx11::string::string((string *)&local_50,pcVar5,&local_89);
  XMLText(&local_88,&local_50);
  paVar1 = &local_88.field_2;
  fprintf(pFVar2,"<program>%s</program>\n",local_88._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pFVar2 = _stdout;
  pcVar5 = ProgramUsage();
  std::__cxx11::string::string((string *)&local_50,pcVar5,&local_89);
  XMLText(&local_88,&local_50);
  fprintf(pFVar2,"<usage>%s</usage>\n",local_88._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_68.
      super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    txt = local_68.
          super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar3 = std::__cxx11::string::compare((char *)&txt->description);
      pFVar2 = _stdout;
      if (iVar3 != 0) {
        local_88.field_2._M_allocated_capacity._4_2_ = 0x3e67;
        local_88.field_2._M_allocated_capacity._0_4_ = 0x616c663c;
        local_88._M_string_length = 6;
        local_88.field_2._M_local_buf[6] = '\0';
        local_88._M_dataplus._M_p = (pointer)paVar1;
        AddXMLTag(&local_88,"file",&txt->filename);
        AddXMLTag(&local_88,"name",&txt->name);
        AddXMLTag(&local_88,"meaning",&txt->description);
        AddXMLTag(&local_88,"default",&txt->default_value);
        AddXMLTag(&local_88,"current",&txt->current_value);
        AddXMLTag(&local_88,"type",&txt->type);
        std::__cxx11::string::append((char *)&local_88);
        fprintf(pFVar2,"%s\n",local_88._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p);
        }
      }
      txt = txt + 1;
    } while (txt != local_68.
                    super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  fwrite("</AllFlags>\n",0xc,1,_stdout);
  std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::~vector
            (&local_68);
  return;
}

Assistant:

static void ShowXMLOfFlags(const char *prog_name) {
  vector<CommandLineFlagInfo> flags;
  GetAllFlags(&flags);   // flags are sorted: by filename, then flagname

  // XML.  There is no corresponding schema yet
  fprintf(stdout, "<?xml version=\"1.0\"?>\n");
  // The document
  fprintf(stdout, "<AllFlags>\n");
  // the program name and usage
  fprintf(stdout, "<program>%s</program>\n",
          XMLText(Basename(prog_name)).c_str());
  fprintf(stdout, "<usage>%s</usage>\n",
          XMLText(ProgramUsage()).c_str());
  // All the flags
  for (vector<CommandLineFlagInfo>::const_iterator flag = flags.begin();
       flag != flags.end();
       ++flag) {
    if (flag->description != kStrippedFlagHelp)
      fprintf(stdout, "%s\n", DescribeOneFlagInXML(*flag).c_str());
  }
  // The end of the document
  fprintf(stdout, "</AllFlags>\n");
}